

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

bool __thiscall re2::Regexp::ComputeSimple(Regexp *this)

{
  byte bVar1;
  CharClassBuilder *pCVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar8;
  LogMessage local_190;
  
  bVar4 = 1;
  switch(this->op_) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x15':
    break;
  case '\x05':
  case '\x06':
    uVar6 = (ulong)this->nsub_;
    if (uVar6 < 2) {
      paVar8 = &this->field_5;
    }
    else {
      paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    bVar4 = uVar6 == 0;
    if ((!(bool)bVar4) && (paVar8->subone_->simple_ != '\0')) {
      uVar3 = 1;
      do {
        uVar7 = uVar3;
        if (uVar6 == uVar7) break;
        uVar3 = uVar7 + 1;
      } while ((paVar8[uVar7].subone_)->simple_ != '\0');
      bVar4 = uVar6 <= uVar7;
    }
    break;
  case '\a':
  case '\b':
  case '\t':
    if (this->nsub_ < 2) {
      paVar8 = &this->field_5;
    }
    else {
      paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    if (paVar8->subone_->simple_ != '\0') {
      bVar1 = paVar8->subone_->op_;
      if (bVar1 < 10) {
        bVar4 = (byte)(0x79 >> (bVar1 & 0x1f));
      }
      break;
    }
  case '\n':
    bVar4 = 0;
    break;
  case '\v':
    if (this->nsub_ < 2) {
      paVar8 = &this->field_5;
    }
    else {
      paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    bVar4 = paVar8->subone_->simple_ != '\0';
    break;
  case '\x14':
    pCVar2 = (this->field_7).field_3.ccb_;
    if (pCVar2 == (CharClassBuilder *)0x0) {
      iVar5 = *(int *)((this->field_7).field_3.cc_ + 4);
    }
    else {
      iVar5 = pCVar2->nrunes_;
    }
    bVar4 = iVar5 != 0x110000 && iVar5 != 0;
    break;
  default:
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/simplify.cc"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_190.str_.super_basic_ostream<char,_std::char_traits<char>_>,
               "Case not handled in ComputeSimple: ",0x23);
    std::operator<<(&local_190.str_.super_basic_ostream<char,_std::char_traits<char>_>,this->op_);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool Regexp::ComputeSimple() {
  Regexp** subs;
  switch (op_) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpLiteral:
    case kRegexpLiteralString:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpBeginText:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpEndText:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpHaveMatch:
      return true;
    case kRegexpConcat:
    case kRegexpAlternate:
      // These are simple as long as the subpieces are simple.
      subs = sub();
      for (int i = 0; i < nsub_; i++)
        if (!subs[i]->simple())
          return false;
      return true;
    case kRegexpCharClass:
      // Simple as long as the char class is not empty, not full.
      if (ccb_ != NULL)
        return !ccb_->empty() && !ccb_->full();
      return !cc_->empty() && !cc_->full();
    case kRegexpCapture:
      subs = sub();
      return subs[0]->simple();
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      subs = sub();
      if (!subs[0]->simple())
        return false;
      switch (subs[0]->op_) {
        case kRegexpStar:
        case kRegexpPlus:
        case kRegexpQuest:
        case kRegexpEmptyMatch:
        case kRegexpNoMatch:
          return false;
        default:
          break;
      }
      return true;
    case kRegexpRepeat:
      return false;
  }
  LOG(DFATAL) << "Case not handled in ComputeSimple: " << op_;
  return false;
}